

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O0

Span * __thiscall tcmalloc::PageHeap::NewWithSizeClass(PageHeap *this,Length n,uint32_t sizeclass)

{
  Span *span_00;
  Span *span;
  LockingContext context;
  uint32_t sizeclass_local;
  Length n_local;
  PageHeap *this_local;
  
  context.grown_by._4_4_ = sizeclass;
  LockingContext::LockingContext((LockingContext *)&span,this,&this->lock_);
  span_00 = NewLocked(this,n,(LockingContext *)&span);
  if ((span_00 != (Span *)0x0) &&
     (InvalidateCachedSizeClass(this,span_00->start), context.grown_by._4_4_ != 0)) {
    RegisterSizeClass(this,span_00,context.grown_by._4_4_);
  }
  LockingContext::~LockingContext((LockingContext *)&span);
  return span_00;
}

Assistant:

Span* PageHeap::NewWithSizeClass(Length n, uint32_t sizeclass) {
  LockingContext context{this, &lock_};

  Span* span = NewLocked(n, &context);
  if (!span) {
    return span;
  }
  InvalidateCachedSizeClass(span->start);
  if (sizeclass) {
    RegisterSizeClass(span, sizeclass);
  }
  return span;
}